

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLSSetLinearSolutionScaling(void *arkode_mem,int onoff)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSSetLinearSolutionScaling",&local_10,&local_18);
  if (iVar1 == 0) {
    if (local_18->matrixbased == 0) {
      iVar1 = -3;
    }
    else {
      local_18->scalesol = onoff;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int arkLSSetLinearSolutionScaling(void *arkode_mem, booleantype onoff)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; store input and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetLinearSolutionScaling",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* check for valid solver type */
  if (!(arkls_mem->matrixbased)) return(ARKLS_ILL_INPUT);

  /* set solution scaling flag */
  arkls_mem->scalesol = onoff;

  return(ARKLS_SUCCESS);
}